

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1160.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  istream *piVar4;
  ulong uVar5;
  ostream *poVar6;
  long lVar7;
  int i;
  int iVar8;
  int i_1;
  int j;
  long lVar9;
  int m;
  int n;
  int l;
  int b;
  int a;
  vector<e,_std::allocator<e>_> v;
  e local_3c;
  
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&n);
  std::istream::operator>>(piVar4,&m);
  v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)0x0;
  for (iVar8 = 0; iVar8 < m; iVar8 = iVar8 + 1) {
    piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&a);
    piVar4 = (istream *)std::istream::operator>>(piVar4,&b);
    std::istream::operator>>(piVar4,&l);
    local_3c.a = a + -1;
    local_3c.b = b + -1;
    local_3c.l = l;
    std::vector<e,_std::allocator<e>_>::emplace_back<e>(&v,&local_3c);
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<e*,std::vector<e,std::allocator<e>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(e,e)>>
            ((__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)
             v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<e_*,_std::vector<e,_std::allocator<e>_>_>)
             v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(e,_e)>)0x10123c);
  uVar5 = 0;
  if (0 < n) {
    uVar5 = (ulong)(uint)n;
  }
  for (lVar7 = 1; lVar7 - uVar5 != 1; lVar7 = lVar7 + 1) {
    r[lVar7] = 0;
    t[lVar7] = (int)lVar7;
  }
  lVar9 = 0;
  for (lVar7 = 0; lVar7 < m; lVar7 = lVar7 + 1) {
    iVar8 = *(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                             super__Vector_impl_data._M_start)->a + lVar9);
    iVar1 = *(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                             super__Vector_impl_data._M_start)->b + lVar9);
    iVar2 = find(iVar8);
    iVar3 = find(iVar1);
    if (iVar2 != iVar3) {
      iVar2 = *(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                               super__Vector_impl_data._M_start)->l + lVar9);
      iVar3 = iVar2;
      if (max < iVar2) {
        iVar3 = *(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                                 super__Vector_impl_data._M_start)->l + lVar9);
        max = iVar2;
      }
      *(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data.
                      _M_start)->l + lVar9) = -iVar3;
      iVar2 = find(iVar8);
      iVar3 = find(iVar1);
      iVar1 = r[iVar2];
      iVar8 = r[iVar3];
      if (iVar8 < iVar1) {
        t[iVar3] = iVar2;
      }
      else {
        t[iVar2] = iVar3;
        if (iVar1 == iVar8) {
          r[iVar3] = iVar1 + 1;
        }
      }
    }
    lVar9 = lVar9 + 0xc;
  }
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,max);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,n + -1);
  std::operator<<(poVar6,"\n");
  lVar7 = 0;
  for (lVar9 = 0; lVar9 < m; lVar9 = lVar9 + 1) {
    if (*(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.super__Vector_impl_data
                        ._M_start)->l + lVar7) < 0) {
      poVar6 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>._M_impl.
                                           super__Vector_impl_data._M_start)->a + lVar7) + 1);
      poVar6 = std::operator<<(poVar6," ");
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,*(int *)((long)&(v.super__Vector_base<e,_std::allocator<e>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->b +
                                         lVar7) + 1);
      std::operator<<(poVar6,"\n");
    }
    lVar7 = lVar7 + 0xc;
  }
  std::_Vector_base<e,_std::allocator<e>_>::~_Vector_base
            (&v.super__Vector_base<e,_std::allocator<e>_>);
  return 0;
}

Assistant:

int main() {
    int n, m;

    std::cin >> n >> m;
    std::vector<e> v;

    for (int i = 0; i < m; ++i) {
        int a, b, l;
        std::cin >> a >> b >> l;
        v.push_back({a - 1, b - 1, l});
    }

    std::sort(v.begin(), v.end(), cmp);

    for (int i = 1; i <= n; i++) {
        r[i] = 0;
        t[i] = i;
    }

    for (int i = 0; i < m; ++i) {
        int n1 = v[i].a;
        int n2 = v[i].b;

        if (find(n1) != find(n2)) {
            if (v[i].l > max) {
                max = v[i].l;
            }
            v[i].l *= -1;

            int x = find(n1);
            int y = find(n2);
            if (r[x] > r[y]) t[y] = x;
            else {
                t[x] = y;
                if (r[x] == r[y]) r[y]++;
            }
        }
    }

    std::cout << max << "\n" << n - 1 << "\n";

    for (int j = 0; j < m; ++j){
        if (v[j].l < 0){
            std::cout << v[j].a + 1 << " " << v[j].b + 1 << "\n";
        }
    }
    return 0;
}